

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_bootstrap_context(sexp_uint_t size,sexp_uint_t max_size)

{
  sexp_heap_conflict psVar1;
  sexp_struct dummy_ctx;
  sexp_heap_conflict heap;
  sexp ctx;
  undefined4 in_stack_ffffffffffff9f14;
  size_t in_stack_ffffffffffff9f18;
  sexp in_stack_ffffffffffff9f20;
  size_t in_stack_ffffffffffff9f28;
  sexp local_8;
  
  psVar1 = sexp_make_heap(in_stack_ffffffffffff9f28,(size_t)in_stack_ffffffffffff9f20,
                          in_stack_ffffffffffff9f18);
  if (psVar1 == (sexp_heap_conflict)0x0) {
    local_8 = (sexp)0x0;
  }
  else {
    local_8 = sexp_alloc_tagged_aux
                        (in_stack_ffffffffffff9f20,in_stack_ffffffffffff9f18,
                         CONCAT44(in_stack_ffffffffffff9f14,0x24));
    if ((local_8 == (sexp)0x0) || ((((ulong)local_8 & 3) == 0 && (local_8->tag == 0x13)))) {
      sexp_free_heap((sexp_heap_conflict)0x112646);
    }
    else {
      (local_8->value).context.heap = psVar1;
    }
  }
  return local_8;
}

Assistant:

sexp sexp_bootstrap_context (sexp_uint_t size, sexp_uint_t max_size) {
  sexp ctx;
  sexp_heap heap;
  struct sexp_struct dummy_ctx;
  if (size < SEXP_MINIMUM_HEAP_SIZE) size = SEXP_INITIAL_HEAP_SIZE;
  size = sexp_heap_align(size);
  max_size = sexp_heap_align(max_size);
  heap = sexp_make_heap(size, max_size, 0);
  if (!heap) return 0;
  sexp_pointer_tag(&dummy_ctx) = SEXP_CONTEXT;
  sexp_context_mark_stack_ptr(&dummy_ctx) = NULL;
  sexp_context_saves(&dummy_ctx) = NULL;
  sexp_context_heap(&dummy_ctx) = heap;
  ctx = sexp_alloc_type(&dummy_ctx, context, SEXP_CONTEXT);
  if (!ctx || sexp_exceptionp(ctx)) {
    sexp_free_heap(heap);
  } else {
    sexp_context_heap(ctx) = heap;
#if SEXP_USE_FIXED_CHUNK_SIZE_HEAPS
    heap->chunk_size = sexp_heap_align(1);
    heap->next = sexp_make_heap(size, max_size, 0);
    if (heap->next) {
      heap->next->chunk_size = sexp_heap_align(1 + sexp_heap_align(1));
      heap->next->next = sexp_make_heap(size, max_size, 0);
      if (heap->next->next) {
        heap->next->next->chunk_size = sexp_heap_align(1 + sexp_heap_align(1 + sexp_heap_align(1)));
        heap->next->next->next = sexp_make_heap(size, max_size, 0);
      }
    }
#endif
  }
  return ctx;
}